

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
::
make_actual_dispatcher<so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>,so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t&>
          (proxy_dispatcher_template_t<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
           *this,environment_t *env,disp_params_t *args)

{
  pointer paVar1;
  unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
  local_28;
  unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
  disp;
  disp_params_t *args_local;
  environment_t *env_local;
  proxy_dispatcher_template_t<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
  *this_local;
  
  disp._M_t.
  super___uniq_ptr_impl<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t_*,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
  .
  super__Head_base<0UL,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>,_true,_true>
        )(__uniq_ptr_data<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>,_true,_true>
          )args;
  stats::activity_tracking_stuff::
  create_appropriate_disp<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>,so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t&>
            ((activity_tracking_stuff *)&local_28,env,(disp_params_t *)(this + 0x10),args);
  paVar1 = std::
           unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
           ::operator->(&local_28);
  (*(paVar1->super_dispatcher_t)._vptr_dispatcher_t[5])(paVar1,this + 0x38);
  paVar1 = std::
           unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
           ::operator->(&local_28);
  (*(paVar1->super_dispatcher_t)._vptr_dispatcher_t[2])(paVar1,env);
  std::
  unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
  ::operator=((unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
               *)(this + 8),&local_28);
  std::
  unique_ptr<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void
		make_actual_dispatcher(
			ENV & env,
			ARGS && ...args )
			{
				using so_5::stats::activity_tracking_stuff::create_appropriate_disp;
				auto disp = create_appropriate_disp<
						DISP_IFACE_TYPE,
						DISP_NO_TRACKING,
						DISP_WITH_TRACKING >(
					env,
					m_disp_params,
					std::forward<ARGS>(args)... );

				disp->set_data_sources_name_base( m_data_source_base_name );
				disp->start( env );

				m_disp = std::move( disp );
			}